

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

void __thiscall QAccessibleTableCell::unselectCell(QAccessibleTableCell *this)

{
  char cVar1;
  SelectionMode SVar2;
  SelectionBehavior SVar3;
  undefined4 uVar4;
  long *plVar5;
  QItemSelectionModel *pQVar6;
  code *UNRECOVERED_JUMPTABLE;
  long in_FS_OFFSET;
  bool bVar7;
  QModelIndex QStack_58;
  QArrayData *local_40;
  ulong local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x10))();
  if ((cVar1 != '\0') &&
     (SVar2 = QAbstractItemView::selectionMode((QAbstractItemView *)(this->view).wp.value),
     SVar2 != NoSelection)) {
    plVar5 = (long *)(**(code **)(*(long *)this + 0xe0))(this);
    plVar5 = (long *)(**(code **)(*plVar5 + 0xa0))(plVar5,5);
    SVar3 = QAbstractItemView::selectionBehavior((QAbstractItemView *)(this->view).wp.value);
    if (SVar3 == SelectRows) {
      if (plVar5 != (long *)0x0) {
        uVar4 = QPersistentModelIndex::row();
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 0x98);
LAB_00532ab3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          (*UNRECOVERED_JUMPTABLE)
                    (plVar5,uVar4,*(long *)(in_FS_OFFSET + 0x28),UNRECOVERED_JUMPTABLE);
          return;
        }
        goto LAB_00532b8c;
      }
    }
    else if (SVar3 == SelectColumns) {
      if (plVar5 != (long *)0x0) {
        uVar4 = QPersistentModelIndex::column();
        UNRECOVERED_JUMPTABLE = *(code **)(*plVar5 + 0xa0);
        goto LAB_00532ab3;
      }
    }
    else {
      if (SVar2 - ContiguousSelection < 0xfffffffe) {
        QAbstractItemView::selectionModel((QAbstractItemView *)(this->view).wp.value);
        QItemSelectionModel::selectedIndexes();
        bVar7 = local_30 < 2;
        if (local_40 != (QArrayData *)0x0) {
          LOCK();
          (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_40,0x18,0x10);
          }
        }
      }
      else {
        bVar7 = false;
      }
      if (!bVar7) {
        pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)(this->view).wp.value);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&QStack_58,&this->m_index);
        (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,&QStack_58,4);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00532b8c:
  __stack_chk_fail();
}

Assistant:

void QAccessibleTableCell::unselectCell()
{
    if (!isValid())
        return;
    QAbstractItemView::SelectionMode selectionMode = view->selectionMode();
    if (selectionMode == QAbstractItemView::NoSelection)
        return;

    QAccessibleTableInterface *cellTable = table()->tableInterface();

    switch (view->selectionBehavior()) {
    case QAbstractItemView::SelectItems:
        break;
    case QAbstractItemView::SelectColumns:
        if (cellTable)
            cellTable->unselectColumn(m_index.column());
        return;
    case QAbstractItemView::SelectRows:
        if (cellTable)
            cellTable->unselectRow(m_index.row());
        return;
    }

    //If the mode is not MultiSelection or ExtendedSelection and only
    //one cell is selected it cannot be unselected by the user
    if ((selectionMode != QAbstractItemView::MultiSelection)
        && (selectionMode != QAbstractItemView::ExtendedSelection)
        && (view->selectionModel()->selectedIndexes().size() <= 1))
        return;

    view->selectionModel()->select(m_index, QItemSelectionModel::Deselect);
}